

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O2

void __thiscall bitio::bitio_exception::bitio_exception(bitio_exception *this,string *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  *(undefined ***)this = &PTR__bitio_exception_00106d98;
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  (this->msg)._M_string_length = 0;
  (this->msg).field_2._M_local_buf[0] = '\0';
  std::operator+(&bStack_38,"bitio: ",msg);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->msg,&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  return;
}

Assistant:

bitio::bitio_exception::bitio_exception(std::string msg) {
    this->msg = "bitio: " + std::move(msg);
}